

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_test.c
# Opt level: O1

char * reset_histogram_on_sample_and_recycle(void)

{
  _Bool _Var1;
  hdr_histogram *phVar2;
  char *pcVar3;
  hdr_interval_recorder recorder;
  hdr_interval_recorder local_40;
  
  hdr_interval_recorder_init_all(&local_40,1,86400000000,3);
  hdr_interval_recorder_record_value(&local_40,0x4d2);
  phVar2 = hdr_interval_recorder_sample_and_recycle(&local_40,(hdr_histogram *)0x0);
  _Var1 = compare_int64(1,phVar2->total_count);
  if (_Var1) {
    phVar2 = hdr_interval_recorder_sample_and_recycle(&local_40,phVar2);
    phVar2 = hdr_interval_recorder_sample_and_recycle(&local_40,phVar2);
    _Var1 = compare_int64(0,phVar2->total_count);
    pcVar3 = "Should have been reset";
    if (_Var1) {
      pcVar3 = (char *)0x0;
    }
  }
  else {
    pcVar3 = "Should have at least one value";
  }
  return pcVar3;
}

Assistant:

static char* reset_histogram_on_sample_and_recycle(void)
{
    struct hdr_interval_recorder recorder;
    struct hdr_histogram* inactive1;
    struct hdr_histogram* sample1;
    struct hdr_histogram* sample2;

    inactive1 = NULL;

    hdr_interval_recorder_init_all(&recorder, 1, INT64_C(24) * 60 * 60 * 1000000, 3);

    hdr_interval_recorder_record_value(&recorder, 1234);

    sample1 = hdr_interval_recorder_sample_and_recycle(&recorder, inactive1);

    mu_assert("Should have at least one value", compare_int64(1, sample1->total_count));

    sample2 = hdr_interval_recorder_sample_and_recycle(&recorder, sample1);
    sample1 = hdr_interval_recorder_sample_and_recycle(&recorder, sample2);

    mu_assert("Should have been reset", compare_int64(0, sample1->total_count));

    return 0;
}